

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O2

obj * getobj(char *let,char *word,obj **ostack)

{
  char cVar1;
  ushort uVar2;
  bool bVar3;
  long lVar4;
  int iVar5;
  obj_use_status oVar6;
  int iVar7;
  uint uVar8;
  char *pcVar9;
  obj *poVar10;
  int iVar11;
  long *out_cnt;
  char *pcVar12;
  byte bVar13;
  ulong uVar14;
  int *count;
  ulong uVar15;
  obj **ppoVar16;
  char cVar17;
  bool bVar18;
  int cnt;
  undefined4 local_3ec;
  char *local_3e8;
  char *local_3e0;
  ulong local_3d8;
  ulong local_3d0;
  long ctmp;
  obj **local_3c0;
  char qbuf [128];
  char buf [256];
  char altlets [256];
  char lets [256];
  
  uVar15 = (ulong)(*let == '\x13');
  uVar14 = (ulong)(let[uVar15] == '\x14');
  lVar4 = uVar14 + uVar15;
  cVar1 = let[uVar14 + uVar15];
  cVar17 = let[(ulong)(cVar1 == '\x15') + lVar4];
  local_3e0 = let + (ulong)(cVar17 == '\x16') + (ulong)(cVar1 == '\x15') + lVar4;
  local_3c0 = ostack;
  if (let[uVar15] == '\x14') {
    iVar5 = strcmp(word,"read");
    local_3ec = CONCAT31((int3)((uint)iVar5 >> 8),iVar5 != 0);
  }
  else {
    local_3ec = 0;
  }
  bVar18 = true;
  if ((*local_3e0 == '\x02') && (iVar5 = strcmp(word,"throw"), iVar5 == 0)) {
    bVar18 = ((youmonst.data)->mflags2 & 0x8000000) == 0;
  }
  local_3d8 = (ulong)(cVar17 == '\x16') ^ 0x2d;
  if (cVar1 == '\x15') {
    pcVar12 = buf + 2;
    buf[0] = (char)local_3d8;
    buf[1] = ' ';
  }
  else {
    pcVar12 = buf;
  }
  local_3e8 = altlets;
  ppoVar16 = &invent;
  cVar17 = '\0';
  iVar5 = 0;
  local_3d0 = uVar15;
LAB_001a8724:
  iVar11 = iVar5;
  uVar14 = local_3d0;
  pcVar9 = local_3e8;
  ppoVar16 = &((obj *)ppoVar16)->nobj->nobj;
  if ((obj *)ppoVar16 != (obj *)0x0) {
    iVar5 = iVar11;
    if (((*local_3e0 == '\0') ||
        (pcVar9 = strchr(local_3e0,(int)((obj *)ppoVar16)->oclass), pcVar9 != (char *)0x0)) ||
       ((!bVar18 && (((obj *)ppoVar16)->otyp == 0x214)))) {
      pcVar12[iVar11] = ((obj *)ppoVar16)->invlet;
      oVar6 = object_selection_checks((obj *)ppoVar16,word);
      if (oVar6 - ALREADY_IN_USE < 2) {
        cVar17 = cVar17 + '\x01';
      }
      else if ((oVar6 != UNSUITABLE_USE) && (iVar5 = iVar11 + 1, oVar6 == CURRENTLY_NOT_USABLE)) {
        uVar14 = 0;
        *local_3e8 = ((obj *)ppoVar16)->invlet;
        local_3e8 = local_3e8 + 1;
        goto LAB_001a8796;
      }
    }
    else {
      iVar7 = strcmp(word,"read");
      if (iVar7 == 0) {
        uVar2 = ((obj *)ppoVar16)->otyp;
        uVar14 = (ulong)uVar2;
        if (((((0x34 < uVar2 - 0xf5) ||
              ((0x10300000000005U >> ((ulong)(uVar2 - 0xf5) & 0x3f) & 1) == 0)) && (uVar2 != 0xc))
            && ((uVar2 != 0x7b && (uVar2 != 0xe4)))) && (((obj *)ppoVar16)->oartifact != '#')) {
          if (obj_descr[objects[(short)uVar2].oc_descr_idx].oc_descr == (char *)0x0)
          goto LAB_001a8724;
          uVar8 = strncmp(obj_descr[objects[(short)uVar2].oc_descr_idx].oc_descr,"runed",5);
          uVar14 = (ulong)uVar8;
          if (uVar8 != 0) goto LAB_001a8724;
        }
LAB_001a8796:
        local_3ec = (undefined4)CONCAT71((int7)(uVar14 >> 8),1);
        iVar5 = iVar11;
      }
    }
    goto LAB_001a8724;
  }
  pcVar12[iVar11] = '\0';
  if ((buf < pcVar12 && iVar11 == 0) && (pcVar12[-1] == ' ')) {
    pcVar12 = pcVar12 + -1;
    *pcVar12 = '\0';
  }
  strcpy(lets,pcVar12);
  if (5 < iVar11) {
    compactify(pcVar12);
  }
  *pcVar9 = '\0';
  if (((cVar1 != '\x15') && (iVar11 == 0)) && ((char)local_3ec == '\0')) {
    pcVar12 = "else ";
    if (cVar17 == '\0') {
      pcVar12 = "";
    }
    pline("You don\'t have anything %sto %s.",pcVar12,word);
    return (obj *)0x0;
  }
  local_3e8 = (char *)CONCAT71(local_3e8._1_7_,'$');
  bVar18 = false;
  uVar15 = local_3d8;
LAB_001a8923:
  cnt = 0;
  bVar13 = (byte)uVar14;
  if (bVar13 == 2) {
    bVar13 = 1;
  }
  check_tutorial_message(0x10b);
  if (buf[0] == '\0') {
    sprintf(qbuf,"What do you want to %s? [*]",word);
  }
  else {
    sprintf(qbuf,"What do you want to %s? [%s or ?*]",word,buf);
  }
  count = &cnt;
  if (bVar13 == 0) {
    count = (int *)0x0;
  }
  cVar17 = query_key(qbuf,count);
  uVar14 = (ulong)(uint)bVar13;
  if (cnt != -1) {
    uVar14 = 2;
  }
  bVar3 = bVar18;
  if (cnt == 0) {
    bVar3 = true;
  }
  if (bVar13 != 1) {
    uVar14 = (ulong)(uint)bVar13;
    bVar3 = bVar18;
  }
  bVar18 = bVar3;
  if (cnt == -1) {
    cnt = 0;
  }
  iVar5 = cnt;
  pcVar12 = strchr(" \r\n\x1b",(int)cVar17);
  if (pcVar12 != (char *)0x0) {
    if (flags.verbose == '\0') {
      return (obj *)0x0;
    }
    pcVar12 = "Never mind.";
LAB_001a8bad:
    pline(pcVar12);
    return (obj *)0x0;
  }
  if (cVar17 == (char)uVar15) {
    if (cVar1 != '\x15') {
      return (obj *)0x0;
    }
    return &zeroobj;
  }
  if (cVar17 == (char)local_3e8) {
    if ((iVar5 == 0) && (bVar18)) {
      return (obj *)0x0;
    }
    if (iVar5 < 0) {
      pcVar12 = "The LRS would be very interested to know you have that much.";
      goto LAB_001a8bad;
    }
  }
  if ((cVar17 == '?') || (cVar17 == '*')) goto LAB_001a8a24;
  goto LAB_001a8ac2;
LAB_001a8a24:
  pcVar12 = (char *)0x0;
  if (cVar17 == '?') {
    pcVar12 = lets;
  }
  pcVar9 = pcVar12;
  if (altlets[0] != '\0') {
    pcVar9 = altlets;
  }
  if (lets[0] != '\0') {
    pcVar9 = pcVar12;
  }
  if (cVar17 != '?') {
    pcVar9 = pcVar12;
  }
  ctmp = 0;
  out_cnt = (long *)0x0;
  if ((char)uVar14 != '\0') {
    out_cnt = &ctmp;
  }
  cVar17 = display_pickinv(pcVar9,'\x01',out_cnt);
  if (cVar17 != '\0') {
    if (-1 < ctmp && (char)uVar14 != '\0') {
      cnt = (int)ctmp;
      if (cnt == 0) {
        bVar18 = true;
      }
      uVar14 = 2;
    }
    if (cVar17 == '\x1b') {
      if (flags.verbose == '\0') {
        return (obj *)0x0;
      }
      pline("Never mind.");
      return (obj *)0x0;
    }
LAB_001a8ac2:
    if ((char)uVar14 == '\x02') {
      iVar5 = strcmp(word,"throw");
      uVar14 = 2;
      if (iVar5 == 0) {
        if ((cnt == 0) && (bVar18)) {
          return (obj *)0x0;
        }
        uVar14 = (ulong)(byte)((cVar17 == (char)local_3e8) + 1);
        if (1 < cnt) {
          pline("You can only throw one item at a time.");
          goto LAB_001a8923;
        }
      }
    }
    iVar5 = cnt;
    iflags.botl = '\x01';
    ppoVar16 = &invent;
    do {
      ppoVar16 = &((obj *)ppoVar16)->nobj->nobj;
      if ((obj *)ppoVar16 == (obj *)0x0) {
        pline("You don\'t have that object.");
        uVar15 = local_3d8;
        goto LAB_001a8923;
      }
    } while (((obj *)ppoVar16)->invlet != cVar17);
    uVar8 = ((obj *)ppoVar16)->quan;
    if (cnt <= (int)uVar8 && -1 < cnt) {
      if (((char)local_3ec == '\0') &&
         (pcVar12 = strchr(local_3e0,(int)((obj *)ppoVar16)->oclass), pcVar12 == (char *)0x0)) {
        silly_thing(word,(obj *)ppoVar16);
      }
      else {
        if ((char)uVar14 != '\x02') {
          return (obj *)ppoVar16;
        }
        if (iVar5 != 0) {
          if (iVar5 == uVar8) {
            return (obj *)ppoVar16;
          }
          if ((((obj *)ppoVar16)->otyp == 0x210) && ((((obj *)ppoVar16)->field_0x4a & 1) != 0)) {
            ((obj *)ppoVar16)->corpsenm = iVar5;
            return (obj *)ppoVar16;
          }
          iVar5 = welded((obj *)ppoVar16);
          if (iVar5 == 0) {
            if (local_3c0 != (obj **)0x0) {
              *local_3c0 = (obj *)ppoVar16;
            }
            poVar10 = splitobj((obj *)ppoVar16,(long)cnt);
            return poVar10;
          }
          return (obj *)ppoVar16;
        }
      }
      return (obj *)0x0;
    }
    pline("You don\'t have that many!  You have only %ld.",(ulong)uVar8);
    uVar15 = local_3d8;
  }
  goto LAB_001a8923;
}

Assistant:

struct obj *getobj(const char *let, const char *word, struct obj **ostack)
{
	struct obj *otmp;
	char ilet;
	char buf[BUFSZ], qbuf[QBUFSZ];
	char lets[BUFSZ], altlets[BUFSZ], *ap;
	int foo = 0;
	char *bp = buf;
	xchar allowcnt = 0;	/* 0, 1 or 2 */
	boolean allowall = FALSE;
	boolean allownone = FALSE;
	char nonechar = '-';
	boolean useboulder = FALSE;
	xchar foox = 0;
	int cnt;
	boolean prezero = FALSE;

	if (*let == ALLOW_COUNT) let++, allowcnt = 1;
	if (*let == ALL_CLASSES) let++, allowall = TRUE;
	if (*let == ALLOW_NONE) let++, allownone = TRUE;
	if (*let == NONE_ON_COMMA) let++, nonechar = ',';
	/* "ugly check" for reading fortune cookies, part 1 */
	/* The normal 'ugly check' keeps the object on the inventory list.
	 * We don't want to do that for shirts/cookies, so the check for
	 * them is handled a bit differently (and also requires that we set
	 * allowall in the caller)
	 */
	if (allowall && !strcmp(word, "read")) allowall = FALSE;

	/* another ugly check: show boulders (not statues) */
	if (*let == WEAPON_CLASS &&
	   !strcmp(word, "throw") && throws_rocks(youmonst.data))
	    useboulder = TRUE;

	if (allownone) *bp++ = nonechar;
	if (bp > buf && bp[-1] == nonechar) *bp++ = ' ';
	ap = altlets;

	ilet = 'a';
	for (otmp = invent; otmp; otmp = otmp->nobj) {
	    if (!*let || strchr(let, otmp->oclass)
		|| (useboulder && otmp->otyp == BOULDER)) {
		bp[foo++] = otmp->invlet;
		
		switch (object_selection_checks(otmp, word)) {
		    case ALREADY_IN_USE: /* eg: wield the weapon in your hands */
		    case ARMOR_TAKEOFF_BLOCKED:
			foo--;
			foox++;
			break;
			
		    case UNSUITABLE_USE: /* eg: putting on a tool */
			foo--;
			break;
		    
		    case CURRENTLY_NOT_USABLE:
			foo--;
			allowall = TRUE;
			*ap++ = otmp->invlet;
			break;
			
		    default: break;
		}

	    } else {

		/* "ugly check" for reading fortune cookies, part 2 */
		if (!strcmp(word, "read") &&
		    (otmp->otyp == FORTUNE_COOKIE ||
		     otmp->otyp == T_SHIRT ||
		     otmp->otyp == TIN ||
		     otmp->otyp == CAN_OF_GREASE ||
		     otmp->otyp == CANDY_BAR ||
		     otmp->otyp == CREDIT_CARD ||
		     otmp->otyp == MAGIC_MARKER ||
		     otmp->otyp == COIN_CLASS ||
		     otmp->oartifact == ART_ORB_OF_FATE ||
		     (OBJ_DESCR(objects[otmp->otyp]) &&
		      !strncmp(OBJ_DESCR(objects[otmp->otyp]), "runed", 5))))
			allowall = TRUE;
	    }

	    if (ilet == 'z') ilet = 'A'; else ilet++;
	}
	bp[foo] = 0;
	if (foo == 0 && bp > buf && bp[-1] == ' ') *--bp = 0;
	strcpy(lets, bp);	/* necessary since we destroy buf */
	if (foo > 5)			/* compactify string */
		compactify(bp);
	*ap = '\0';

	if (!foo && !allowall && !allownone) {
		pline("You don't have anything %sto %s.",
			foox ? "else " : "", word);
		return NULL;
	}
	for (;;) {
		cnt = 0;
		if (allowcnt == 2)
		    allowcnt = 1;  /* abort previous count */
		check_tutorial_message(QT_T_CHOOSEITEM);
		if (!buf[0]) {
			sprintf(qbuf, "What do you want to %s? [*]", word);
		} else {
			sprintf(qbuf, "What do you want to %s? [%s or ?*]",
				word, buf);
		}
		ilet = query_key(qbuf, allowcnt ? &cnt : NULL);
		if (allowcnt == 1 && cnt != -1) {
		    allowcnt = 2; /* signal presence of cnt */
		    if (cnt == 0)
			prezero = TRUE; /* cnt was explicitly set to 0 */
		}
		if (cnt == -1)
		    cnt = 0;
		
		if (strchr(quitchars,ilet)) {
		    if (flags.verbose)
			pline("Never mind.");
		    return NULL;
		}
		if (ilet == nonechar) {
			return allownone ? &zeroobj : NULL;
		}
		if (ilet == def_oc_syms[COIN_CLASS]) {
			if (cnt == 0 && prezero) return NULL;
			/* Historic note: early Nethack had a bug which was
			 * first reported for Larn, where trying to drop 2^32-n
			 * gold pieces was allowed, and did interesting things
			 * to your money supply.  The LRS is the tax bureau
			 * from Larn.
			 */
			if (cnt < 0) {
	pline("The LRS would be very interested to know you have that much.");
				return NULL;
			}
		}
		if (ilet == '?' || ilet == '*') {
		    char *allowed_choices = (ilet == '?') ? lets : NULL;
		    long ctmp = 0;

		    if (ilet == '?' && !*lets && *altlets)
			allowed_choices = altlets;
		    ilet = display_pickinv(allowed_choices, TRUE,
					   allowcnt ? &ctmp : NULL);
		    if (!ilet) continue;
		    if (allowcnt && ctmp >= 0) {
			cnt = ctmp;
			if (!cnt) prezero = TRUE;
			allowcnt = 2;
		    }
		    if (ilet == '\033') {
			if (flags.verbose)
			    pline("Never mind.");
			return NULL;
		    }
		    /* they typed a letter (not a space) at the prompt */
		}
		if (allowcnt == 2 && !strcmp(word,"throw")) {
		    /* permit counts for throwing gold, but don't accept
		     * counts for other things since the throw code will
		     * split off a single item anyway */
		    if (ilet != def_oc_syms[COIN_CLASS])
			allowcnt = 1;
		    if (cnt == 0 && prezero) return NULL;
		    if (cnt > 1) {
			pline("You can only throw one item at a time.");
			continue;
		    }
		}
		iflags.botl = 1; /* May have changed the amount of money */

		for (otmp = invent; otmp; otmp = otmp->nobj)
			if (otmp->invlet == ilet) break;
		if (!otmp) {
			pline("You don't have that object.");
			continue;
		} else if (cnt < 0 || otmp->quan < cnt) {
			pline("You don't have that many!  You have only %ld.",
			    otmp->quan);
			continue;
		}
		break;
	}
	if (!allowall && let && !strchr(let,otmp->oclass)) {
		silly_thing(word, otmp);
		return NULL;
	}
	if (allowcnt == 2) {	/* cnt given */
	    if (cnt == 0) return NULL;
	    if (cnt != otmp->quan) {
		/* don't split a stack of cursed loadstones */
		if (otmp->otyp == LOADSTONE && otmp->cursed) {
		    /* kludge for canletgo()'s can't-drop-this message */
		    otmp->corpsenm = (int) cnt;
		} else if (welded(otmp)) {
		    /* don't split a stack of wielded, cursed weapons */
		} else {
		    if (ostack) *ostack = otmp;
		    otmp = splitobj(otmp, cnt);
		}
	    }
	}
	return otmp;
}